

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::addQueue(CLIntercept *this,cl_context context,cl_command_queue queue)

{
  mutex *__mutex;
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  _List_node_base *local_28;
  cl_context local_20;
  
  if (queue != (cl_command_queue)0x0) {
    __mutex = &this->m_Mutex;
    local_28 = (_List_node_base *)queue;
    local_20 = context;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      uVar7 = std::__throw_system_error(iVar3);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar7);
    }
    uVar2 = this->m_QueueNumber;
    pmVar4 = std::
             map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
             ::operator[](&this->m_QueueNumberMap,(key_type *)&local_28);
    *pmVar4 = uVar2 + 1;
    this->m_QueueNumber = this->m_QueueNumber + 1;
    pmVar5 = std::
             map<_cl_context_*,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>_>_>_>
             ::operator[](&this->m_ContextQueuesMap,&local_20);
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = local_28;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(pmVar5->super__List_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::addQueue(
    cl_context context,
    cl_command_queue queue )
{
    if( queue )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_QueueNumberMap[ queue ] = m_QueueNumber + 1;  // should be nonzero
        m_QueueNumber++;

        m_ContextQueuesMap[context].push_back(queue);
    }
}